

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O0

void __thiscall
QMdi::ControlContainer::removeButtonsFromMenuBar(ControlContainer *this,QMenuBar *menuBar)

{
  long lVar1;
  bool bVar2;
  QWidgetPrivate *pQVar3;
  QWidget *pQVar4;
  QMenuBar *pQVar5;
  long in_RSI;
  QMdiSubWindowPrivate *in_RDI;
  long in_FS_OFFSET;
  ControlElement<QMdi::ControlLabel> *ce_1;
  ControlElement<QMdi::ControllerWidget> *ce;
  QMdiSubWindow *child;
  QWidget *currentLeft;
  QWidget *currentRight;
  QWidget *in_stack_ffffffffffffff88;
  QPointer<QWidget> *in_stack_ffffffffffffff90;
  undefined8 in_stack_ffffffffffffff98;
  Corner corner;
  QMdiSubWindowPrivate *in_stack_ffffffffffffffa8;
  ControlElement<QMdi::ControllerWidget> *in_stack_ffffffffffffffb0;
  QMdiSubWindow *local_48;
  
  corner = (Corner)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_RSI != 0) &&
     (bVar2 = ::operator!=((QMenuBar **)in_stack_ffffffffffffff90,
                           (QPointer<QMenuBar> *)in_stack_ffffffffffffff88), bVar2)) {
    QPointer<QWidget>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QPointer<QWidget>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    QPointer<QMenuBar>::operator=
              ((QPointer<QMenuBar> *)in_stack_ffffffffffffff90,(QMenuBar *)in_stack_ffffffffffffff88
              );
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMenuBar> *)0x62bf20);
  if ((!bVar2) ||
     (bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x62bf34), !bVar2))
  goto LAB_0062c2f4;
  QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62bf48);
  QWidget::window((QWidget *)in_RDI);
  pQVar3 = qt_widget_private((QWidget *)0x62bf58);
  if ((*(uint *)&(pQVar3->data).field_0x10 >> 0x12 & 1) != 0) goto LAB_0062c2f4;
  local_48 = (QMdiSubWindow *)0x0;
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62bf85);
  if (bVar2) {
    QPointer<QMenuBar>::operator->((QPointer<QMenuBar> *)0x62bf9c);
    QMenuBar::cornerWidget((QMenuBar *)in_stack_ffffffffffffffa8,(Corner)((ulong)in_RDI >> 0x20));
    bVar2 = ::operator==((QWidget **)in_stack_ffffffffffffff90,
                         (QPointer<QWidget> *)in_stack_ffffffffffffff88);
    if (bVar2) {
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62bfd8);
      in_stack_ffffffffffffffb0 = ptr<QMdi::ControllerWidget>(in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffffb0 != (ControlElement<QMdi::ControllerWidget> *)0x0) {
        bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x62bffb);
        if (bVar2) {
          pQVar4 = &QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62c00f)->
                    super_QWidget;
          bVar2 = QWidget::isMaximized(pQVar4);
          if (bVar2) {
            local_48 = ::QPointer::operator_cast_to_QMdiSubWindow_
                                 ((QPointer<QMdiSubWindow> *)0x62c03d);
            goto LAB_0062c044;
          }
        }
        QPointer<QWidget>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
LAB_0062c044:
      pQVar5 = QPointer<QMenuBar>::operator->((QPointer<QMenuBar> *)0x62c052);
      corner = (Corner)((ulong)pQVar5 >> 0x20);
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62c065);
      QMenuBar::setCornerWidget((QMenuBar *)in_stack_ffffffffffffffa8,(QWidget *)in_RDI,corner);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62c085);
      if (bVar2) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c099);
        QWidget::show((QWidget *)in_RDI);
        QPointer<QWidget>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
    }
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c0c3);
    QWidget::hide((QWidget *)0x62c0cb);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c0d9);
    QWidget::setParent((QWidget *)in_stack_ffffffffffffffb0,(QWidget *)in_stack_ffffffffffffffa8);
  }
  bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62c0f3);
  if (bVar2) {
    QPointer<QMenuBar>::operator->((QPointer<QMenuBar> *)0x62c10a);
    QMenuBar::cornerWidget((QMenuBar *)in_stack_ffffffffffffffa8,(Corner)((ulong)in_RDI >> 0x20));
    bVar2 = ::operator==((QWidget **)in_stack_ffffffffffffff90,
                         (QPointer<QWidget> *)in_stack_ffffffffffffff88);
    if (bVar2) {
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62c143);
      in_stack_ffffffffffffffa8 =
           (QMdiSubWindowPrivate *)ptr<QMdi::ControlLabel>(in_stack_ffffffffffffff88);
      if (in_stack_ffffffffffffffa8 != (QMdiSubWindowPrivate *)0x0) {
        bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x62c166);
        if (bVar2) {
          pQVar4 = &QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62c17a)->
                    super_QWidget;
          bVar2 = QWidget::isMaximized(pQVar4);
          if (bVar2) {
            if (local_48 == (QMdiSubWindow *)0x0) {
              local_48 = ::QPointer::operator_cast_to_QMdiSubWindow_
                                   ((QPointer<QMdiSubWindow> *)0x62c1b0);
            }
            goto LAB_0062c1b9;
          }
        }
        QPointer<QWidget>::operator=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
LAB_0062c1b9:
      pQVar5 = QPointer<QMenuBar>::operator->((QPointer<QMenuBar> *)0x62c1c7);
      ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x62c1da);
      QMenuBar::setCornerWidget((QMenuBar *)in_stack_ffffffffffffffa8,(QWidget *)in_RDI,corner);
      bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QWidget> *)0x62c1f7);
      if (bVar2) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c20b);
        QWidget::show((QWidget *)in_RDI);
        QPointer<QWidget>::operator=((QPointer<QWidget> *)pQVar5,in_stack_ffffffffffffff88);
      }
    }
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c235);
    QWidget::hide((QWidget *)0x62c23d);
    QPointer<QWidget>::operator->((QPointer<QWidget> *)0x62c24b);
    QWidget::setParent((QWidget *)in_stack_ffffffffffffffb0,(QWidget *)in_stack_ffffffffffffffa8);
  }
  QPointer<QMenuBar>::operator->((QPointer<QMenuBar> *)0x62c265);
  QWidget::update(in_stack_ffffffffffffff88);
  if (local_48 == (QMdiSubWindow *)0x0) {
    bVar2 = ::QPointer::operator_cast_to_bool((QPointer<QMdiSubWindow> *)0x62c297);
    if (bVar2) {
      QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62c2ab);
      QWidget::window((QWidget *)in_RDI);
      QPointer<QMdiSubWindow>::operator->((QPointer<QMdiSubWindow> *)0x62c2c5);
      QMdiSubWindow::d_func((QMdiSubWindow *)0x62c2cd);
      QMdiSubWindowPrivate::originalWindowTitle(in_stack_ffffffffffffffa8);
      QWidget::setWindowTitle
                ((QWidget *)in_stack_ffffffffffffffb0,(QString *)in_stack_ffffffffffffffa8);
      QString::~QString((QString *)0x62c2f2);
    }
  }
  else {
    QMdiSubWindow::d_func((QMdiSubWindow *)0x62c27f);
    QMdiSubWindowPrivate::setNewWindowTitle(in_RDI);
  }
LAB_0062c2f4:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ControlContainer::removeButtonsFromMenuBar(QMenuBar *menuBar)
{
    if (menuBar && menuBar != m_menuBar) {
        // m_menubar was deleted while sub-window was maximized
        previousRight = nullptr;
        previousLeft = nullptr;
        m_menuBar = menuBar;
    }

    if (!m_menuBar || !mdiChild || qt_widget_private(mdiChild->window())->data.in_destructor)
        return;

    QMdiSubWindow *child = nullptr;
    if (m_controllerWidget) {
        QWidget *currentRight = m_menuBar->cornerWidget(Qt::TopRightCorner);
        if (currentRight == m_controllerWidget) {
            if (ControlElement<ControllerWidget> *ce = ptr<ControllerWidget>(previousRight)) {
                if (!ce->mdiChild || !ce->mdiChild->isMaximized())
                    previousRight = nullptr;
                else
                    child = ce->mdiChild;
            }
            m_menuBar->setCornerWidget(previousRight, Qt::TopRightCorner);
            if (previousRight) {
                previousRight->show();
                previousRight = nullptr;
            }
        }
        m_controllerWidget->hide();
        m_controllerWidget->setParent(nullptr);
    }
    if (m_menuLabel) {
        QWidget *currentLeft = m_menuBar->cornerWidget(Qt::TopLeftCorner);
        if (currentLeft == m_menuLabel) {
            if (ControlElement<ControlLabel> *ce = ptr<ControlLabel>(previousLeft)) {
                if (!ce->mdiChild || !ce->mdiChild->isMaximized())
                    previousLeft = nullptr;
                else if (!child)
                    child = mdiChild;
            }
            m_menuBar->setCornerWidget(previousLeft, Qt::TopLeftCorner);
            if (previousLeft) {
                previousLeft->show();
                previousLeft = nullptr;
            }
        }
        m_menuLabel->hide();
        m_menuLabel->setParent(nullptr);
    }
    m_menuBar->update();
    if (child)
        child->d_func()->setNewWindowTitle();
    else if (mdiChild)
        mdiChild->window()->setWindowTitle(mdiChild->d_func()->originalWindowTitle());
}